

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O3

void __thiscall ProKey::ProKey(ProKey *this,char *str)

{
  char *pcVar1;
  size_t sVar2;
  storage_type *psVar3;
  int iVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  
  if (str == (char *)0x0) {
    iVar4 = 0;
    QVar6.m_data = (storage_type *)0x0;
    QVar6.m_size = (qsizetype)this;
    QString::fromLatin1(QVar6);
    (this->super_ProString).m_offset = 0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = str + 1 + (long)psVar3;
      psVar3 = psVar3 + 1;
    } while (*pcVar1 != '\0');
    QVar5.m_data = psVar3;
    QVar5.m_size = (qsizetype)this;
    QString::fromLatin1(QVar5);
    (this->super_ProString).m_offset = 0;
    sVar2 = strlen(str);
    iVar4 = (int)sVar2;
  }
  (this->super_ProString).m_length = iVar4;
  (this->super_ProString).m_file = 0;
  ProString::updatedHash(&this->super_ProString);
  return;
}

Assistant:

ProKey::ProKey(const char *str) :
    ProString(str, DoHash)
{
}